

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O2

void __thiscall Rml::FontEffectGlowInstancer::FontEffectGlowInstancer(FontEffectGlowInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  String local_90;
  String local_70;
  String local_50;
  String local_30;
  
  FontEffectInstancer::FontEffectInstancer(&this->super_FontEffectInstancer);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer =
       (_func_int **)&PTR__FontEffectGlowInstancer_00398c08;
  this->id_width_outline = Invalid;
  this->id_width_blur = Invalid;
  this->id_color = Invalid;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"width-outline",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"1px",&local_92);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_70,&local_90,true);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"length",&local_93);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_94);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_30,&local_50);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_width_outline = PVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"width-blur",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"-1px",&local_92);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_70,&local_90,true);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"length",&local_93);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_94);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_30,&local_50);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_width_blur = PVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"offset-x",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"0px",&local_92);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_70,&local_90,true);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"length",&local_93);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_94);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_30,&local_50);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_offset_x = PVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"offset-y",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"0px",&local_92);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_70,&local_90,true);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"length",&local_93);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_94);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_30,&local_50);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_offset_y = PVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"color",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"white",&local_92);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_70,&local_90,false);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"color",&local_93);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_94);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_30,&local_50);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"font-effect",(allocator<char> *)&local_30);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"width-outline, width-blur, offset-x, offset-y, color",
             (allocator<char> *)&local_50);
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_70,&local_90,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

FontEffectGlowInstancer::FontEffectGlowInstancer() :
	id_width_outline(PropertyId::Invalid), id_width_blur(PropertyId::Invalid), id_color(PropertyId::Invalid)
{
	id_width_outline = RegisterProperty("width-outline", "1px", true).AddParser("length").GetId();
	id_width_blur = RegisterProperty("width-blur", "-1px", true).AddParser("length").GetId();
	id_offset_x = RegisterProperty("offset-x", "0px", true).AddParser("length").GetId();
	id_offset_y = RegisterProperty("offset-y", "0px", true).AddParser("length").GetId();
	id_color = RegisterProperty("color", "white", false).AddParser("color").GetId();
	RegisterShorthand("font-effect", "width-outline, width-blur, offset-x, offset-y, color", ShorthandType::FallThrough);
}